

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cconv.c
# Opt level: O3

void cconv_array_tab(CTState *cts,CType *d,uint8_t *dp,GCtab *t,CTInfo flags)

{
  uint uVar1;
  uint uVar2;
  CType *pCVar3;
  uint uVar4;
  CTInfo CVar5;
  TValue *o;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  
  pCVar3 = cts->tab;
  CVar5 = d->info;
  uVar1 = d->size;
  uVar2 = pCVar3[(ushort)CVar5].size;
  lVar8 = 0;
  uVar7 = 0;
  uVar6 = 0;
  do {
    if (uVar7 < t->asize) {
      o = (TValue *)((t->array).ptr64 + lVar8);
    }
    else {
      o = lj_tab_getinth(t,(int32_t)uVar7);
    }
    if ((o == (TValue *)0x0) || (o->u64 == 0xffffffffffffffff)) {
      if (uVar7 != 0) {
        if (uVar1 != 0xffffffff) {
          uVar4 = uVar2;
          if (uVar6 != uVar2) {
            memset(dp + uVar6,0,(ulong)(uVar1 - uVar6));
            return;
          }
          for (; uVar4 < uVar1; uVar4 = uVar4 + uVar2) {
            memcpy(dp + uVar4,dp,(ulong)uVar2);
          }
        }
        return;
      }
    }
    else {
      if (uVar1 <= uVar6) {
        cconv_err_initov(cts,d);
      }
      lj_cconv_ct_tv(cts,pCVar3 + (ushort)CVar5,dp + uVar6,o,flags);
      uVar6 = uVar6 + uVar2;
    }
    uVar7 = uVar7 + 1;
    lVar8 = lVar8 + 8;
  } while( true );
}

Assistant:

static void cconv_array_tab(CTState *cts, CType *d,
			    uint8_t *dp, GCtab *t, CTInfo flags)
{
  int32_t i;
  CType *dc = ctype_rawchild(cts, d);  /* Array element type. */
  CTSize size = d->size, esize = dc->size, ofs = 0;
  for (i = 0; ; i++) {
    TValue *tv = (TValue *)lj_tab_getint(t, i);
    if (!tv || tvisnil(tv)) {
      if (i == 0) continue;  /* Try again for 1-based tables. */
      break;  /* Stop at first nil. */
    }
    if (ofs >= size)
      cconv_err_initov(cts, d);
    lj_cconv_ct_tv(cts, dc, dp + ofs, tv, flags);
    ofs += esize;
  }
  if (size != CTSIZE_INVALID) {  /* Only fill up arrays with known size. */
    if (ofs == esize) {  /* Replicate a single element. */
      for (; ofs < size; ofs += esize) memcpy(dp + ofs, dp, esize);
    } else {  /* Otherwise fill the remainder with zero. */
      memset(dp + ofs, 0, size - ofs);
    }
  }
}